

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O0

DOMNode * __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setNamedItemNS(DOMNamedNodeMapImpl *this,DOMNode *arg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  DOMNodeImpl *pDVar7;
  DOMDocument *pDVar8;
  DOMException *pDVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XMLSize_t XVar10;
  DOMNode *p;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  DOMNode *local_158;
  MemoryManager *local_148;
  DOMDocumentImpl *local_138;
  long local_128;
  MemoryManager *local_118;
  MemoryManager *local_108;
  DOMDocumentImpl *local_f8;
  long local_e8;
  MemoryManager *local_d8;
  MemoryManager *local_c8;
  DOMDocumentImpl *local_b8;
  long local_a8;
  MemoryManager *local_98;
  XMLCh *nLocalName;
  XMLCh *nNamespaceURI;
  DOMNode *n;
  XMLSize_t size;
  XMLSize_t i;
  XMLSize_t index;
  XMLCh *localName;
  XMLCh *namespaceURI;
  DOMNodeImpl *argImpl;
  DOMDocument *doc;
  DOMNode *arg_local;
  DOMNamedNodeMapImpl *this_local;
  DOMDocument *pDVar6;
  
  iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
  pDVar6 = (DOMDocument *)CONCAT44(extraout_var,iVar2);
  pDVar7 = xercesc_4_0::castToNodeImpl(arg);
  pDVar8 = DOMNodeImpl::getOwnerDocument(pDVar7);
  if (pDVar8 != pDVar6) {
    pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_98 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        local_a8 = 0;
      }
      else {
        local_a8 = CONCAT44(extraout_var_00,iVar2) + -8;
      }
      if (local_a8 == 0) {
        local_c8 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_01,iVar2) == 0) {
          local_b8 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_b8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_01,iVar2) + -8);
        }
        local_c8 = DOMDocumentImpl::getMemoryManager(local_b8);
      }
      local_98 = local_c8;
    }
    DOMException::DOMException(pDVar9,4,0,local_98);
    __cxa_throw(pDVar9,&DOMException::typeinfo,DOMException::~DOMException);
  }
  bVar1 = readOnly(this);
  if (bVar1) {
    pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_d8 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        local_e8 = 0;
      }
      else {
        local_e8 = CONCAT44(extraout_var_02,iVar2) + -8;
      }
      if (local_e8 == 0) {
        local_108 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_03,iVar2) == 0) {
          local_f8 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_f8 = (DOMDocumentImpl *)(CONCAT44(extraout_var_03,iVar2) + -8);
        }
        local_108 = DOMDocumentImpl::getMemoryManager(local_f8);
      }
      local_d8 = local_108;
    }
    DOMException::DOMException(pDVar9,7,0,local_d8);
    __cxa_throw(pDVar9,&DOMException::typeinfo,DOMException::~DOMException);
  }
  bVar1 = DOMNodeImpl::isOwned(pDVar7);
  if (bVar1) {
    pDVar9 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fOwnerNode == (DOMNode *)0x0) {
      local_118 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_04,iVar2) == 0) {
        local_128 = 0;
      }
      else {
        local_128 = CONCAT44(extraout_var_04,iVar2) + -8;
      }
      if (local_128 == 0) {
        local_148 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
        if (CONCAT44(extraout_var_05,iVar2) == 0) {
          local_138 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_138 = (DOMDocumentImpl *)(CONCAT44(extraout_var_05,iVar2) + -8);
        }
        local_148 = DOMDocumentImpl::getMemoryManager(local_138);
      }
      local_118 = local_148;
    }
    DOMException::DOMException(pDVar9,10,0,local_118);
    __cxa_throw(pDVar9,&DOMException::typeinfo,DOMException::~DOMException);
  }
  pDVar7->fOwnerNode = this->fOwnerNode;
  DOMNodeImpl::isOwned(pDVar7,true);
  iVar2 = (*arg->_vptr_DOMNode[0x16])();
  iVar3 = (*arg->_vptr_DOMNode[0x18])();
  i = 0;
  do {
    if (0xc0 < i) {
      iVar2 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[2])(this,arg);
      return (DOMNode *)CONCAT44(extraout_var_11,iVar2);
    }
    if (this->fBuckets[i] != (DOMNodeVector *)0x0) {
      XVar10 = DOMNodeVector::size(this->fBuckets[i]);
      for (size = 0; size < XVar10; size = size + 1) {
        p = DOMNodeVector::elementAt(this->fBuckets[i],size);
        iVar4 = (*p->_vptr_DOMNode[0x16])();
        iVar5 = (*p->_vptr_DOMNode[0x18])();
        bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_08,iVar4),
                                  (XMLCh *)CONCAT44(extraout_var_06,iVar2));
        if (bVar1) {
          bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar3),
                                    (XMLCh *)CONCAT44(extraout_var_09,iVar5));
          if (bVar1) {
LAB_00301437:
            DOMNodeVector::setElementAt(this->fBuckets[i],arg,size);
            local_158 = (DOMNode *)0x0;
            if (pDVar6 != (DOMDocument *)0x0) {
              local_158 = &pDVar6->super_DOMNode;
            }
            pDVar7 = xercesc_4_0::castToNodeImpl(p);
            pDVar7->fOwnerNode = local_158;
            pDVar7 = xercesc_4_0::castToNodeImpl(p);
            DOMNodeImpl::isOwned(pDVar7,false);
            return p;
          }
          if ((XMLCh *)CONCAT44(extraout_var_09,iVar5) == (XMLCh *)0x0) {
            iVar4 = (*p->_vptr_DOMNode[2])();
            bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar3),
                                      (XMLCh *)CONCAT44(extraout_var_10,iVar4));
            if (bVar1) goto LAB_00301437;
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

DOMNode * DOMNamedNodeMapImpl::setNamedItemNS(DOMNode *arg)
{
    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if (argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR,0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (argImpl->isOwned())
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);

    const XMLCh* namespaceURI=arg->getNamespaceURI();
    const XMLCh* localName=arg->getLocalName();
    // the map is indexed using the full name of nodes; to search given a namespace and a local name
    // we have to do a linear search
    for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
        if(fBuckets[index]==0)
            continue;

        XMLSize_t i = 0;
        XMLSize_t size = fBuckets[index]->size();
        for (i = 0; i < size; ++i) {
            DOMNode *n=fBuckets[index]->elementAt(i);
            const XMLCh * nNamespaceURI = n->getNamespaceURI();
            const XMLCh * nLocalName = n->getLocalName();
            if (!XMLString::equals(nNamespaceURI, namespaceURI))    //URI not match
                continue;
            else {
                if (XMLString::equals(localName, nLocalName)
                    ||
                    (nLocalName == 0 && XMLString::equals(localName, n->getNodeName()))) {
                    fBuckets[index]->setElementAt(arg,i);
                    castToNodeImpl(n)->fOwnerNode = doc;
                    castToNodeImpl(n)->isOwned(false);
                    return n;
                }
            }
        }
    }
    // if not found, add it using the full name as key
    return setNamedItem(arg);
}